

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

unit_data units::precise::custom::equation_unit(uint16_t equation_number)

{
  int counts;
  int radians;
  uint per_unit;
  uint iflag;
  uint eflag;
  uint16_t in_DI;
  unit_data local_14;
  
  counts = bShift(in_DI,3);
  radians = bShift(in_DI,4);
  per_unit = bShiftu(in_DI,2);
  iflag = bShiftu(in_DI,1);
  eflag = bShiftu(in_DI,0);
  units::detail::unit_data::unit_data
            (&local_14,0,0,0,0,0,0,0,0,counts,radians,per_unit,iflag,eflag,1);
  return local_14;
}

Assistant:

constexpr detail::unit_data equation_unit(std::uint16_t equation_number)
        {
            return {
                0,
                0,
                0,
                0,
                0,
                0,
                0,
                0,
                bShift(equation_number, 3U),
                // 3 and 4 switched on purpose so radian is the high bit
                bShift(equation_number, 4U),
                bShiftu(equation_number, 2U),
                bShiftu(equation_number, 1U),
                bShiftu(equation_number, 0U),
                1};
        }